

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::clara::TextFlow::Columns::iterator::operator*[abi_cxx11_(iterator *this)

{
  size_t sVar1;
  undefined1 uVar2;
  size_type sVar3;
  const_reference this_00;
  ulong uVar4;
  long lVar5;
  undefined8 *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  size_t width;
  size_t i;
  string *row;
  string col;
  string padding;
  iterator *in_stack_fffffffffffffe78;
  iterator *in_stack_fffffffffffffe80;
  Column *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  Column local_112;
  size_t local_d0;
  ulong local_c8;
  byte local_b9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b9 = 0;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::string(local_28);
  local_c8 = 0;
  while( true ) {
    uVar4 = local_c8;
    sVar3 = std::
            vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
            ::size((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                    *)*in_RSI);
    if (sVar3 <= uVar4) break;
    this_00 = std::
              vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              ::operator[]((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                            *)*in_RSI,local_c8);
    local_d0 = Column::width(this_00);
    std::
    vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
    ::operator[]((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                  *)(in_RSI + 1),local_c8);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    operator[]((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                *)*in_RSI,local_c8);
    Column::end(in_stack_fffffffffffffe90);
    uVar2 = Column::iterator::operator!=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    sVar1 = local_d0;
    if ((bool)uVar2) {
      std::
      vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
      ::operator[]((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                    *)(in_RSI + 1),local_c8);
      Column::iterator::operator*[abi_cxx11_((iterator *)CONCAT17(uVar2,in_stack_fffffffffffffeb0));
      ::std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_68);
      ::std::__cxx11::string::~string(local_68);
      uVar4 = ::std::__cxx11::string::size();
      sVar1 = local_d0;
      if (uVar4 < local_d0) {
        lVar5 = ::std::__cxx11::string::size();
        in_stack_fffffffffffffea0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - lVar5);
        in_stack_fffffffffffffea8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_112.m_strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_88,(ulong)in_stack_fffffffffffffea0,' ',
                   (allocator *)in_stack_fffffffffffffea8);
        ::std::__cxx11::string::operator=(local_28,local_88);
        ::std::__cxx11::string::~string(local_88);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&local_112.m_strings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      else {
        ::std::__cxx11::string::operator=(local_28,"");
      }
      ::std::__cxx11::string::~string(local_48);
    }
    else {
      in_stack_fffffffffffffe90 = &local_112;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,sVar1,' ',(allocator *)in_stack_fffffffffffffe90);
      ::std::__cxx11::string::operator+=(local_28,local_a8);
      ::std::__cxx11::string::~string(local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_112);
    }
    local_c8 = local_c8 + 1;
  }
  local_b9 = 1;
  ::std::__cxx11::string::~string(local_28);
  if ((local_b9 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

auto operator *() const -> std::string {
			std::string row, padding;

			for (size_t i = 0; i < m_columns.size(); ++i) {
				auto width = m_columns[i].width();
				if (m_iterators[i] != m_columns[i].end()) {
					std::string col = *m_iterators[i];
					row += padding + col;
					if (col.size() < width)
						padding = std::string(width - col.size(), ' ');
					else
						padding = "";
				} else {
					padding += std::string(width, ' ');
				}
			}
			return row;
		}